

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O2

intptr_t fiobj_data_write(FIOBJ io,void *buffer,uintptr_t length)

{
  size_t sVar1;
  int *piVar2;
  int64_t __offset;
  ssize_t sVar3;
  long lVar4;
  int __fd;
  
  if (((io == 0) || (sVar1 = fiobj_type_is(io,(fiobj_type_enum)buffer), sVar1 == 0)) ||
     (length != 0 && buffer == (void *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    return -1;
  }
  piVar2 = __errno_location();
  *piVar2 = 0;
  __fd = *(int *)(io + 0x30);
  if (__fd == -2) {
    fiobj_data_assert_dynamic(io);
    __fd = *(int *)(io + 0x30);
  }
  if (__fd == -1) {
    fiobj_data_pre_write(io,length + 1);
    memcpy((void *)(*(long *)(io + 8) + *(long *)(io + 0x20)),buffer,length);
    lVar4 = *(long *)(io + 0x20) + length;
    *(long *)(io + 0x20) = lVar4;
    *(undefined1 *)(*(long *)(io + 8) + lVar4) = 0;
    return length;
  }
  __offset = fiobj_data_get_fd_size(io);
  sVar3 = pwrite(__fd,buffer,length,__offset);
  return sVar3;
}

Assistant:

intptr_t fiobj_data_write(FIOBJ io, void *buffer, uintptr_t length) {
  if (!io || !FIOBJ_TYPE_IS(io, FIOBJ_T_DATA) || (!buffer && length)) {
    errno = EFAULT;
    return -1;
  }
  errno = 0;
  /* Unslice slices */
  if (obj2io(io)->fd == -2)
    fiobj_data_assert_dynamic(io);

  if (obj2io(io)->fd == -1) {
    /* String Code */
    fiobj_data_pre_write(io, length + 1);
    memcpy(obj2io(io)->buffer + obj2io(io)->len, buffer, length);
    obj2io(io)->len = obj2io(io)->len + length;
    obj2io(io)->buffer[obj2io(io)->len] = 0;
    return length;
  }

  /* File Code */
  return pwrite(obj2io(io)->fd, buffer, length, fiobj_data_get_fd_size(io));
}